

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mt.c
# Opt level: O1

void sylvan_mt_quit(void)

{
  if (mt_initialized == '\x01') {
    mt_initialized = '\0';
    free(cl_registry);
    cl_registry = (customleaf_t *)0x0;
    cl_registry_count = 0;
    cl_registry_size = 0;
  }
  return;
}

Assistant:

static void
sylvan_mt_quit()
{
    if (mt_initialized == 0) return;
    mt_initialized = 0;

    free(cl_registry);
    cl_registry = NULL;
    cl_registry_count = 0;
    cl_registry_size = 0;
}